

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::WriteXML(cmCTestLaunch *this)

{
  bool bVar1;
  char *pcVar2;
  char *local_2e8;
  allocator local_2d9;
  string local_2d8;
  undefined1 local_2b8 [8];
  cmXMLWriter xml;
  cmGeneratedFileStream fxml;
  string local_30 [8];
  string logXML;
  cmCTestLaunch *this_local;
  
  logXML.field_2._8_8_ = this;
  std::__cxx11::string::string(local_30,(string *)&this->LogDir);
  bVar1 = IsError(this);
  pcVar2 = "warning-";
  if (bVar1) {
    pcVar2 = "error-";
  }
  std::__cxx11::string::operator+=(local_30,pcVar2);
  std::__cxx11::string::operator+=(local_30,(string *)&this->LogHash);
  std::__cxx11::string::operator+=(local_30,".xml");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&xml.ElementOpen,pcVar2,false);
  cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_2b8,(ostream *)&xml.ElementOpen,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"Failure",&local_2d9);
  cmXMLWriter::StartElement((cmXMLWriter *)local_2b8,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  bVar1 = IsError(this);
  local_2e8 = "Warning";
  if (bVar1) {
    local_2e8 = "Error";
  }
  cmXMLWriter::Attribute<char_const*>((cmXMLWriter *)local_2b8,"type",&local_2e8);
  WriteXMLAction(this,(cmXMLWriter *)local_2b8);
  WriteXMLCommand(this,(cmXMLWriter *)local_2b8);
  WriteXMLResult(this,(cmXMLWriter *)local_2b8);
  WriteXMLLabels(this,(cmXMLWriter *)local_2b8);
  cmXMLWriter::EndElement((cmXMLWriter *)local_2b8);
  cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_2b8);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&xml.ElementOpen);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmCTestLaunch::WriteXML()
{
  // Name the xml file.
  std::string logXML = this->LogDir;
  logXML += this->IsError()? "error-" : "warning-";
  logXML += this->LogHash;
  logXML += ".xml";

  // Use cmGeneratedFileStream to atomically create the report file.
  cmGeneratedFileStream fxml(logXML.c_str());
  cmXMLWriter xml(fxml, 2);
  xml.StartElement("Failure");
  xml.Attribute("type", this->IsError() ? "Error" : "Warning");
  this->WriteXMLAction(xml);
  this->WriteXMLCommand(xml);
  this->WriteXMLResult(xml);
  this->WriteXMLLabels(xml);
  xml.EndElement(); // Failure
}